

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O0

void __thiscall
singleParticleSpectra::calculate_four_particle_correlation_Cn4
          (singleParticleSpectra *this,vector<double,_std::allocator<double>_> *event_Qn_real,
          vector<double,_std::allocator<double>_> *event_Qn_imag,
          vector<double,_std::allocator<double>_> *corr,
          vector<double,_std::allocator<double>_> *corr_err)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  reference pvVar13;
  vector<double,_std::allocator<double>_> *in_RCX;
  string *in_RDX;
  pretty_ostream *in_RSI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_R8;
  double dVar14;
  double dVar15;
  double corr_local;
  double Re_Q2n_QnQn;
  double abs_Q2n_2;
  double abs_Qn_2;
  int ii;
  int i;
  double dN;
  char (*in_stack_fffffffffffffec8) [40];
  pretty_ostream *in_stack_fffffffffffffed0;
  allocator local_59;
  string local_58 [32];
  int local_38;
  int local_34;
  value_type local_30;
  vector<double,_std::allocator<double>_> *local_28;
  vector<double,_std::allocator<double>_> *local_20;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)in_RSI,0);
  local_30 = *pvVar13;
  local_34 = 0;
  while( true ) {
    if (*(int *)(in_RDI + 0x790) <= local_34) {
      return;
    }
    local_38 = local_34 << 1;
    if (*(int *)(in_RDI + 0x1c8) < local_38) break;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)in_RSI,(long)local_34);
    in_stack_fffffffffffffed0 = (pretty_ostream *)*pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)in_RSI,(long)local_34);
    dVar15 = *pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)in_RDX,(long)local_34);
    in_stack_fffffffffffffec8 = (char (*) [40])*pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)in_RDX,(long)local_34);
    dVar14 = (double)in_stack_fffffffffffffed0 * dVar15 +
             (double)in_stack_fffffffffffffec8 * *pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)in_RSI,(long)local_38);
    dVar15 = *pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)in_RSI,(long)local_38);
    dVar1 = *pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)in_RDX,(long)local_38);
    dVar2 = *pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)in_RDX,(long)local_38);
    dVar3 = *pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)in_RSI,(long)local_34);
    dVar4 = *pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)in_RSI,(long)local_38);
    dVar5 = *pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)in_RSI,(long)local_34);
    dVar6 = *pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)in_RDX,(long)local_38);
    dVar7 = *pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)in_RDX,(long)local_34);
    dVar8 = *pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)in_RDX,(long)local_34);
    dVar9 = *pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)in_RSI,(long)local_34);
    dVar10 = *pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)in_RDX,(long)local_38);
    dVar11 = *pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)in_RSI,(long)local_38);
    dVar12 = *pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)in_RDX,(long)local_34);
    dVar15 = local_30 * 2.0 * (local_30 - 3.0) +
             -((local_30 - 2.0) * 4.0) * dVar14 +
             dVar14 * dVar14 +
             -((dVar4 * (dVar5 * dVar6 + dVar7 * dVar8) +
               dVar9 * (dVar10 * dVar11 + -(dVar12 * *pvVar13))) * 2.0) +
             dVar15 * dVar1 + dVar2 * dVar3;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)local_34);
    *pvVar13 = dVar15 + *pvVar13;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)local_34);
    *pvVar13 = dVar15 * dVar15 + *pvVar13;
    local_34 = local_34 + 1;
  }
  pretty_ostream::operator<<(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  pretty_ostream::operator<<(in_stack_fffffffffffffed0,(char (*) [23])in_stack_fffffffffffffec8);
  pretty_ostream::operator<<(in_stack_fffffffffffffed0,(int *)in_stack_fffffffffffffec8);
  pretty_ostream::operator<<(in_stack_fffffffffffffed0,(char (*) [6])in_stack_fffffffffffffec8);
  pretty_ostream::operator<<(in_stack_fffffffffffffed0,(int *)in_stack_fffffffffffffec8);
  pretty_ostream::operator<<(in_stack_fffffffffffffed0,(char (*) [28])in_stack_fffffffffffffec8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"error",&local_59);
  pretty_ostream::flush(in_RSI,in_RDX);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  exit(1);
}

Assistant:

void singleParticleSpectra::calculate_four_particle_correlation_Cn4(
    vector<double> &event_Qn_real, vector<double> &event_Qn_imag,
    vector<double> &corr, vector<double> &corr_err) {
    // C_n[0] = N(N-1)(N-2)(N-3) is the number of pairs
    double dN = event_Qn_real[0];
    for (int i = 0; i < num_Cn4; i++) {
        int ii = 2 * i;
        if (ii > order_max) {
            messager << "Error: the vn needed for C_n{4} is not "
                     << "computed, order_max = " << order_max << "2n = " << ii
                     << ". Make sure order_max > 2n!";
            messager.flush("error");
            exit(1);
        }
        double abs_Qn_2 =
            (event_Qn_real[i] * event_Qn_real[i]
             + event_Qn_imag[i] * event_Qn_imag[i]);
        double abs_Q2n_2 =
            (event_Qn_real[ii] * event_Qn_real[ii]
             + event_Qn_imag[ii] * event_Qn_imag[ii]);

        double Re_Q2n_QnQn =
            (event_Qn_real[i]
                 * (event_Qn_real[ii] * event_Qn_real[i]
                    + event_Qn_imag[ii] * event_Qn_imag[i])
             + event_Qn_imag[i]
                   * (event_Qn_real[i] * event_Qn_imag[ii]
                      - event_Qn_real[ii] * event_Qn_imag[i]));

        double corr_local =
            (abs_Qn_2 * abs_Qn_2 - 2. * Re_Q2n_QnQn - 4. * (dN - 2.) * abs_Qn_2
             + abs_Q2n_2 + 2. * dN * (dN - 3.));
        corr[i] += corr_local;
        corr_err[i] += corr_local * corr_local;
    }
}